

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int omp_pause_resource_(kmp_pause_status_t kind,int device_num)

{
  code *pcVar1;
  int in_ESI;
  undefined4 in_EDI;
  _func_int_kmp_pause_status_t_int *fptr;
  int local_4;
  
  if (in_ESI == -10) {
    local_4 = __kmpc_pause_resource(0x1cccec);
  }
  else {
    pcVar1 = (code *)dlsym(0,"tgt_pause_resource");
    if (pcVar1 == (code *)0x0) {
      local_4 = 1;
    }
    else {
      local_4 = (*pcVar1)(in_EDI,in_ESI);
    }
  }
  return local_4;
}

Assistant:

int FTN_STDCALL FTN_PAUSE_RESOURCE(kmp_pause_status_t kind, int device_num) {
#ifdef KMP_STUB
  return 1; // just fail
#else
  if (device_num == KMP_HOST_DEVICE)
    return __kmpc_pause_resource(kind);
  else {
#if !KMP_OS_WINDOWS
    int (*fptr)(kmp_pause_status_t, int);
    if ((*(void **)(&fptr) = dlsym(RTLD_DEFAULT, "tgt_pause_resource")))
      return (*fptr)(kind, device_num);
    else
#endif
      return 1; // just fail if there is no libomptarget
  }
#endif
}